

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>>
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                *lhs,Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
                     *rhs,
               Transpose<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
  *this_00;
  double *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *pTVar2;
  Index cols;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  ScalarWithConstIfNotLvalue **ppSVar6;
  Scalar SVar7;
  Scalar SVar8;
  double alpha_00;
  ScalarWithConstIfNotLvalue *local_288;
  EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
  *local_280;
  double *local_278;
  size_t local_270;
  Index local_268;
  TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
  *local_260;
  Index local_258;
  Scalar *local_250;
  double *local_248;
  Scalar *local_240;
  Scalar *local_238;
  double local_230;
  double local_228;
  BlockImpl_dense<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>,__1,_1,_true,_true>
  local_220;
  const_blas_data_mapper<double,_long,_0> local_1d0 [2];
  const_blas_data_mapper<double,_long,_1> local_1b0;
  undefined1 local_1a0 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<double,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *dest_local;
  Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
  *rhs_local;
  Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
  *lhs_local;
  
  ppSVar6 = &local_288;
  blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
  ::extract((ExtractType *)
            &actualRhs.m_matrix.m_matrix.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
             .m_outerStride,lhs);
  blas_traits<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
  ::extract((ExtractType *)&actualAlpha,rhs);
  local_230 = *alpha;
  SVar7 = blas_traits<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>_>
          ::extractScalarFactor(lhs);
  local_228 = local_230 * SVar7;
  SVar8 = blas_traits<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
          ::extractScalarFactor(rhs);
  alpha_00 = local_228 * SVar8;
  uVar3 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
                  *)&actualAlpha);
  if (0x1fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
                    *)&actualAlpha);
    if ((ulong)(IVar5 * 8) < 0x20001) {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
                      *)&actualAlpha);
      lVar1 = -(IVar5 * 8 + 0x1eU & 0xfffffffffffffff0);
      ppSVar6 = (ScalarWithConstIfNotLvalue **)((long)&local_288 + lVar1);
      local_240 = (Scalar *)((long)&local_280 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
                      *)&actualAlpha);
      local_240 = (Scalar *)aligned_malloc(IVar5 << 3);
    }
    local_238 = local_240;
  }
  else {
    local_238 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_Eigen::Dense>
                ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,_Eigen::Dense>
                        *)&actualAlpha);
    ppSVar6 = &local_288;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_238;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e79d;
  pSVar4 = TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_Eigen::Dense>
           ::data((TransposeImpl<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,_Eigen::Dense>
                   *)&actualAlpha);
  if (pSVar4 == (Scalar *)0x0) {
    local_248 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_248 = (double *)0x0;
  }
  local_278 = local_248;
  local_280 = (EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
               *)&actualAlpha;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e7df;
  local_270 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>_>
                      *)&actualAlpha);
  this_00 = local_280;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e7f2;
  IVar5 = EigenBase<Eigen::Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>_>
          ::size(this_00);
  size = local_270;
  ptr = local_278;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e81c;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_1a0,ptr,size,
             0x20000 < (ulong)(IVar5 << 3));
  this = &actualRhs.m_matrix.m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
          .m_outerStride;
  local_260 = (TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
               *)this;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e82f;
  local_268 = Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::rows((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                      *)this);
  pTVar2 = local_260;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e842;
  local_258 = Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::cols((Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                      *)pTVar2);
  pTVar2 = local_260;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e855;
  local_250 = TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
              ::data(pTVar2);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e86a;
  local_1b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride =
       TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Dense>
       ::outerStride((TransposeImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Dense>
                      *)&actualRhs.m_matrix.m_matrix.
                         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                         .m_outerStride);
  local_1b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = local_250;
  local_1d0[0].super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
       (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_1d0[0].super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e97c;
  local_288 = TransposeImpl<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e99c;
  DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
  ::col((ColXpr *)&local_220,
        (DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
         *)dest,0);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e9aa;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_-1,_1,_true,_true>
            ::innerStride(&local_220);
  cols = local_258;
  rows = local_268;
  res = local_288;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e9dd;
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(rows,cols,&local_1b0,local_1d0,res,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x22e9eb;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_1a0);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }